

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

TSNode * ts_node__descendant_for_point_range
                   (TSNode *__return_storage_ptr__,TSNode self,TSPoint min,TSPoint max,
                   _Bool include_anonymous)

{
  TSNode self_00;
  _Bool _Var1;
  TSNode child;
  TSNode node;
  NodeChildIterator iterator;
  uint local_b8;
  uint local_b0;
  TSNode local_a8;
  TSNode local_88;
  NodeChildIterator local_60;
  
  local_88.id = self.id;
  local_88.tree = self.tree;
  local_88.context[0] = self.context[0];
  local_88.context[1] = self.context[1];
  local_88.context[2] = self.context[2];
  local_88.context[3] = self.context[3];
  __return_storage_ptr__->id = self.id;
  __return_storage_ptr__->tree = self.tree;
  *(undefined8 *)__return_storage_ptr__->context = self.context._0_8_;
  *(undefined8 *)(__return_storage_ptr__->context + 2) = self.context._8_8_;
  while( true ) {
    ts_node_iterate_children(&local_88);
    do {
      _Var1 = ts_node_child_iterator_next(&local_60,&local_a8);
      if (!_Var1) {
        return __return_storage_ptr__;
      }
    } while ((local_60.position.extent.row <= max.row) &&
            ((local_60.position.extent.row != max.row ||
             (local_60.position.extent.column <= max.column))));
    local_b0 = min.row;
    if ((local_b0 < local_a8.context[1]) ||
       ((local_a8.context[1] == local_b0 && (local_b8 = min.column, local_b8 < local_a8.context[2]))
       )) break;
    local_88.context[1] = local_a8.context[1];
    local_88.context[0] = local_a8.context[0];
    local_88.context[3] = local_a8.context[3];
    local_88.context[2] = local_a8.context[2];
    local_88.id = local_a8.id;
    local_88.tree = local_a8.tree;
    self_00.context[1] = local_a8.context[1];
    self_00.context[0] = local_a8.context[0];
    self_00.context[3] = local_a8.context[3];
    self_00.context[2] = local_a8.context[2];
    self_00.id = local_a8.id;
    self_00.tree = local_a8.tree;
    _Var1 = ts_node__is_relevant(self_00,include_anonymous);
    if (_Var1) {
      ts_tree_set_cached_parent(self.tree,&local_a8,__return_storage_ptr__);
      __return_storage_ptr__->id = local_a8.id;
      __return_storage_ptr__->tree = local_a8.tree;
      *(ulong *)__return_storage_ptr__->context = CONCAT44(local_a8.context[1],local_a8.context[0]);
      *(ulong *)(__return_storage_ptr__->context + 2) =
           CONCAT44(local_a8.context[3],local_a8.context[2]);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static inline TSNode ts_node__descendant_for_point_range(TSNode self, TSPoint min,
                                                         TSPoint max,
                                                         bool include_anonymous) {
  TSNode node = self;
  TSNode last_visible_node = self;

  bool did_descend = true;
  while (did_descend) {
    did_descend = false;

    TSNode child;
    NodeChildIterator iterator = ts_node_iterate_children(&node);
    while (ts_node_child_iterator_next(&iterator, &child)) {
      if (point_gt(iterator.position.extent, max)) {
        if (point_gt(ts_node_start_point(child), min)) break;
        node = child;
        if (ts_node__is_relevant(node, include_anonymous)) {
          ts_tree_set_cached_parent(self.tree, &child, &last_visible_node);
          last_visible_node = node;
        }
        did_descend = true;
        break;
      }
    }
  }

  return last_visible_node;
}